

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O3

int luaB_tonumber(lua_State *L)

{
  ushort uVar1;
  ushort *puVar2;
  int iVar3;
  lua_Integer lVar4;
  char *pcVar5;
  size_t sVar6;
  ushort **ppuVar7;
  byte *pbVar8;
  __int32_t **pp_Var9;
  size_t sVar10;
  undefined8 in_RCX;
  ulong uVar11;
  byte *__s;
  long lVar12;
  size_t l;
  lua_Integer local_58;
  size_t local_50;
  char *local_48;
  lua_State *local_40;
  undefined8 local_38;
  
  iVar3 = lua_type(L,2);
  if (iVar3 < 1) {
    luaL_checkany(L,1);
    iVar3 = lua_type(L,1);
    if (iVar3 == 3) {
      lua_settop(L,1);
      return 1;
    }
    pcVar5 = lua_tolstring(L,1,&local_50);
    if ((pcVar5 != (char *)0x0) && (sVar10 = lua_stringtonumber(L,pcVar5), sVar10 == local_50 + 1))
    {
      return 1;
    }
  }
  else {
    lVar4 = luaL_checkinteger(L,2);
    luaL_checktype(L,1,4);
    pcVar5 = lua_tolstring(L,1,&local_50);
    if (0x22 < lVar4 - 2U) {
      luaL_argerror(L,2,"base out of range");
    }
    sVar6 = strspn(pcVar5," \f\n\r\t\v");
    local_38 = CONCAT71((int7)((ulong)in_RCX >> 8),pcVar5[sVar6]);
    __s = (byte *)(pcVar5 + ((pcVar5[sVar6] - 0x2bU & 0xfd) == 0) + sVar6);
    ppuVar7 = __ctype_b_loc();
    puVar2 = *ppuVar7;
    uVar11 = (ulong)*__s;
    uVar1 = puVar2[uVar11];
    local_58 = 0;
    pbVar8 = (byte *)0x0;
    if ((uVar1 & 8) != 0) {
      local_58 = 0;
      lVar12 = 0;
      local_48 = pcVar5;
      local_40 = L;
      do {
        if ((uVar1 >> 0xb & 1) == 0) {
          pp_Var9 = __ctype_toupper_loc();
          iVar3 = (*pp_Var9)[uVar11] + -0x37;
        }
        else {
          iVar3 = (char)uVar11 + -0x30;
        }
        if ((int)lVar4 <= iVar3) {
          pbVar8 = (byte *)0x0;
          pcVar5 = local_48;
          L = local_40;
          goto LAB_0011fb94;
        }
        lVar12 = (long)iVar3 + lVar12 * (int)lVar4;
        uVar11 = (ulong)__s[1];
        __s = __s + 1;
        uVar1 = puVar2[uVar11];
      } while ((uVar1 & 8) != 0);
      sVar6 = strspn((char *)__s," \f\n\r\t\v");
      pbVar8 = __s + sVar6;
      pcVar5 = local_48;
      L = local_40;
      local_58 = -lVar12;
      if ((char)local_38 != '-') {
        local_58 = lVar12;
      }
    }
LAB_0011fb94:
    if (pbVar8 == (byte *)(pcVar5 + local_50)) {
      lua_pushinteger(L,local_58);
      return 1;
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int luaB_tonumber(lua_State *L) {
    if (lua_isnoneornil(L, 2)) {  /* standard conversion? */
        luaL_checkany(L, 1);
        if (lua_type(L, 1) == LUA_TNUMBER) {  /* already a number? */
            lua_settop(L, 1);  /* yes; return it */
            return 1;
        } else {
            size_t l;
            const char *s = lua_tolstring(L, 1, &l);
            if (s != NULL && lua_stringtonumber(L, s) == l + 1)
                return 1;  /* successful conversion to number */
            /* else not a number */
        }
    } else {
        size_t l;
        const char *s;
        lua_Integer n = 0;  /* to avoid warnings */
        lua_Integer base = luaL_checkinteger(L, 2);
        luaL_checktype(L, 1, LUA_TSTRING);  /* no numbers as strings */
        s = lua_tolstring(L, 1, &l);
        luaL_argcheck(L, 2 <= base && base <= 36, 2, "base out of range");
        if (b_str2int(s, (int) base, &n) == s + l) {
            lua_pushinteger(L, n);
            return 1;
        }  /* else not a number */
    }  /* else not a number */
    lua_pushnil(L);  /* not a number */
    return 1;
}